

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall deci::ast_unary_t::~ast_unary_t(ast_unary_t *this)

{
  if (this->chain != (ast_item_t *)0x0) {
    (*this->chain->_vptr_ast_item_t[4])();
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3d8;
  return;
}

Assistant:

ast_unary_t::~ast_unary_t() {
    delete this->chain;
  }